

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall
tinygltf::TinyGLTF::WriteGltfSceneToFile
          (TinyGLTF *this,Model *model,string *filename,bool embedImages,bool embedBuffers,
          bool prettyPrint,bool writeBinary)

{
  pointer pBVar1;
  pointer puVar2;
  pointer pbVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  Buffer *obj;
  pointer pbVar10;
  string *this_00;
  int __val;
  string binSavePath;
  json buffer;
  JsonDocument output;
  json buffers;
  string binFilename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedFilenames;
  string binUri;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binBuffer;
  string defaultBinFilename;
  string baseDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string defaultBinFileExt;
  string uri;
  string local_50;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&output,(nullptr_t)0x0);
  GetBaseFilename(&defaultBinFilename,filename);
  std::__cxx11::string::string((string *)&defaultBinFileExt,".bin",(allocator *)&uri);
  lVar8 = std::__cxx11::string::rfind((char)&defaultBinFilename,0x2e);
  if (lVar8 != -1) {
    std::__cxx11::string::substr((ulong)&uri,(ulong)&defaultBinFilename);
    std::__cxx11::string::operator=((string *)&defaultBinFilename,(string *)&uri);
    std::__cxx11::string::~string((string *)&uri);
  }
  GetBaseDir(&baseDir,filename);
  if (baseDir._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&baseDir);
  }
  SerializeGltfModel(model,&output);
  usedFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  usedFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  usedFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((model->buffers).super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->buffers).super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&buffers,(nullptr_t)0x0);
    uVar7 = 0;
    while( true ) {
      uVar9 = (ulong)uVar7;
      if ((ulong)(((long)(model->buffers).
                         super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(model->buffers).
                        super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x160) <= uVar9) break;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&buffer,(nullptr_t)0x0);
      if (uVar9 == 0 && writeBinary) {
        pBVar1 = (model->buffers).
                 super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pBVar1[uVar9].uri._M_string_length != 0) goto LAB_0011d89e;
        SerializeGltfBufferBin(pBVar1 + uVar9,&buffer,&binBuffer);
      }
      else {
LAB_0011d89e:
        if (!embedBuffers) {
          binSavePath._M_dataplus._M_p = (pointer)&binSavePath.field_2;
          binSavePath._M_string_length = 0;
          binFilename._M_dataplus._M_p = (pointer)&binFilename.field_2;
          binFilename._M_string_length = 0;
          binSavePath.field_2._M_local_buf[0] = '\0';
          binFilename.field_2._M_local_buf[0] = '\0';
          binUri._M_dataplus._M_p = (pointer)&binUri.field_2;
          binUri._M_string_length = 0;
          binUri.field_2._M_local_buf[0] = '\0';
          pBVar1 = (model->buffers).
                   super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((pBVar1[uVar9].uri._M_string_length == 0) ||
             (bVar4 = IsDataURI(&pBVar1[uVar9].uri), bVar4)) {
            std::operator+(&uri,&defaultBinFilename,&defaultBinFileExt);
            std::__cxx11::string::operator=((string *)&binFilename,(string *)&uri);
            std::__cxx11::string::~string((string *)&uri);
            __val = 0;
            bVar4 = true;
LAB_0011d985:
            pbVar3 = usedFilenames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar10 = usedFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (bVar4) {
              do {
                bVar4 = pbVar10 != pbVar3;
                if (pbVar10 == pbVar3) goto LAB_0011d985;
                iVar6 = std::__cxx11::string::compare((string *)&binFilename);
                pbVar10 = pbVar10 + 1;
              } while (iVar6 != 0);
              std::__cxx11::to_string(&local_50,__val);
              std::operator+(&local_290,&defaultBinFilename,&local_50);
              std::operator+(&uri,&local_290,&defaultBinFileExt);
              __val = __val + 1;
              std::__cxx11::string::operator=((string *)&binFilename,(string *)&uri);
              std::__cxx11::string::~string((string *)&uri);
              std::__cxx11::string::~string((string *)&local_290);
              std::__cxx11::string::~string((string *)&local_50);
              goto LAB_0011d985;
            }
            if ((this->uri_cb).encode.super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__cxx11::string::_M_assign((string *)&binUri);
            }
            else {
              std::__cxx11::string::string((string *)&uri,"buffer",(allocator *)&local_290);
              bVar4 = std::
                      function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*)>
                      ::operator()(&(this->uri_cb).encode,&binFilename,&uri,&binUri,
                                   (this->uri_cb).user_data);
              std::__cxx11::string::~string((string *)&uri);
              if (!bVar4) goto LAB_0011df45;
            }
LAB_0011db23:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&usedFilenames,&binFilename);
            JoinPath(&uri,&baseDir,&binFilename);
            std::__cxx11::string::operator=((string *)&binSavePath,(string *)&uri);
            std::__cxx11::string::~string((string *)&uri);
            obj = (model->buffers).
                  super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar9;
            std::ofstream::ofstream(&uri,binSavePath._M_dataplus._M_p,_S_bin);
            cVar5 = std::__basic_file<char>::is_open();
            if (cVar5 == '\0') {
              std::ofstream::~ofstream(&uri);
            }
            else {
              puVar2 = (obj->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((obj->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish != puVar2) {
                std::ostream::write((char *)&uri,(long)puVar2);
              }
              std::ofstream::~ofstream(&uri);
              std::__cxx11::string::string((string *)&uri,"byteLength",(allocator *)&local_290);
              SerializeNumberProperty<unsigned_long>
                        (&uri,(long)(obj->data).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(obj->data).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,&buffer);
              std::__cxx11::string::~string((string *)&uri);
              std::__cxx11::string::string((string *)&uri,"uri",(allocator *)&local_290);
              SerializeStringProperty(&uri,&binUri,&buffer);
              std::__cxx11::string::~string((string *)&uri);
              if ((obj->name)._M_string_length != 0) {
                std::__cxx11::string::string((string *)&uri,"name",(allocator *)&local_290);
                SerializeStringProperty(&uri,&obj->name,&buffer);
                std::__cxx11::string::~string((string *)&uri);
              }
              SerializeExtrasAndExtensions<tinygltf::Buffer>(obj,&buffer);
            }
            std::__cxx11::string::~string((string *)&binUri);
            std::__cxx11::string::~string((string *)&binFilename);
            std::__cxx11::string::~string((string *)&binSavePath);
            if (cVar5 != '\0') goto LAB_0011dcae;
          }
          else {
            std::__cxx11::string::_M_assign((string *)&binUri);
            bVar4 = std::
                    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*)>
                    ::operator()(&(this->uri_cb).decode,&binUri,&binFilename,
                                 (this->uri_cb).user_data);
            if (bVar4) goto LAB_0011db23;
LAB_0011df45:
            std::__cxx11::string::~string((string *)&binUri);
            std::__cxx11::string::~string((string *)&binFilename);
            std::__cxx11::string::~string((string *)&binSavePath);
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&buffer);
          this_00 = (string *)&buffers;
          goto LAB_0011df7b;
        }
        SerializeGltfBuffer((model->buffers).
                            super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar9,&buffer);
      }
LAB_0011dcae:
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back(&buffers,&buffer);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&buffer);
      uVar7 = uVar7 + 1;
    }
    detail::JsonAddMember(&output,"buffers",&buffers);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&buffers);
  }
  if ((model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_start) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&binSavePath,(nullptr_t)0x0);
    for (uVar7 = 0; uVar9 = (ulong)uVar7,
        uVar9 < (ulong)(((long)(model->images).
                               super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(model->images).
                              super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x1a8); uVar7 = uVar7 + 1)
    {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&binFilename,(nullptr_t)0x0);
      uri._M_dataplus._M_p = (pointer)&uri.field_2;
      uri._M_string_length = 0;
      uri.field_2._M_local_buf[0] = '\0';
      bVar4 = UpdateImageObject((model->images).
                                super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar9,&baseDir,uVar7,
                                embedImages,&this->fs,&this->uri_cb,&this->WriteImageData,
                                this->write_image_user_data_,&uri);
      if (!bVar4) {
        std::__cxx11::string::~string((string *)&uri);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&binFilename);
        this_00 = &binSavePath;
LAB_0011df7b:
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)this_00);
        bVar4 = false;
        goto LAB_0011df82;
      }
      SerializeGltfImage((model->images).
                         super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar9,&uri,(json *)&binFilename)
      ;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&binSavePath,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&binFilename);
      std::__cxx11::string::~string((string *)&uri);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&binFilename);
    }
    detail::JsonAddMember(&output,"images",(json *)&binSavePath);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&binSavePath);
  }
  if (writeBinary) {
    detail::JsonToString(&binSavePath,&output,-1);
    std::ofstream::ofstream(&uri,(filename->_M_dataplus)._M_p,_S_bin);
    bVar4 = WriteBinaryGltfStream((ostream *)&uri,&binSavePath,&binBuffer);
  }
  else {
    detail::JsonToString(&binSavePath,&output,prettyPrint - 1 | 2);
    std::ofstream::ofstream(&uri,(filename->_M_dataplus)._M_p,_S_out);
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      bVar4 = false;
    }
    else {
      bVar4 = WriteGltfStream((ostream *)&uri,&binSavePath);
    }
  }
  std::ofstream::~ofstream(&uri);
  std::__cxx11::string::~string((string *)&binSavePath);
LAB_0011df82:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&binBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&usedFilenames);
  std::__cxx11::string::~string((string *)&baseDir);
  std::__cxx11::string::~string((string *)&defaultBinFileExt);
  std::__cxx11::string::~string((string *)&defaultBinFilename);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&output);
  return bVar4;
}

Assistant:

bool TinyGLTF::WriteGltfSceneToFile(const Model *model,
                                    const std::string &filename,
                                    bool embedImages = false,
                                    bool embedBuffers = false,
                                    bool prettyPrint = true,
                                    bool writeBinary = false) {
  detail::JsonDocument output;
  std::string defaultBinFilename = GetBaseFilename(filename);
  std::string defaultBinFileExt = ".bin";
  std::string::size_type pos =
      defaultBinFilename.rfind('.', defaultBinFilename.length());

  if (pos != std::string::npos) {
    defaultBinFilename = defaultBinFilename.substr(0, pos);
  }
  std::string baseDir = GetBaseDir(filename);
  if (baseDir.empty()) {
    baseDir = "./";
  }
  /// Serialize all properties except buffers and images.
  SerializeGltfModel(model, output);

  // BUFFERS
  std::vector<std::string> usedFilenames;
  std::vector<unsigned char> binBuffer;
  if (model->buffers.size()) {
    detail::json buffers;
    detail::JsonReserveArray(buffers, model->buffers.size());
    for (unsigned int i = 0; i < model->buffers.size(); ++i) {
      detail::json buffer;
      if (writeBinary && i == 0 && model->buffers[i].uri.empty()) {
        SerializeGltfBufferBin(model->buffers[i], buffer, binBuffer);
      } else if (embedBuffers) {
        SerializeGltfBuffer(model->buffers[i], buffer);
      } else {
        std::string binSavePath;
        std::string binFilename;
        std::string binUri;
        if (!model->buffers[i].uri.empty() &&
            !IsDataURI(model->buffers[i].uri)) {
          binUri = model->buffers[i].uri;
          if (!uri_cb.decode(binUri, &binFilename, uri_cb.user_data)) {
            return false;
          }
        } else {
          binFilename = defaultBinFilename + defaultBinFileExt;
          bool inUse = true;
          int numUsed = 0;
          while (inUse) {
            inUse = false;
            for (const std::string &usedName : usedFilenames) {
              if (binFilename.compare(usedName) != 0) continue;
              inUse = true;
              binFilename = defaultBinFilename + std::to_string(numUsed++) +
                            defaultBinFileExt;
              break;
            }
          }

          if (uri_cb.encode) {
            if (!uri_cb.encode(binFilename, "buffer", &binUri,
                               uri_cb.user_data)) {
              return false;
            }
          } else {
            binUri = binFilename;
          }
        }
        usedFilenames.push_back(binFilename);
        binSavePath = JoinPath(baseDir, binFilename);
        if (!SerializeGltfBuffer(model->buffers[i], buffer, binSavePath,
                                 binUri)) {
          return false;
        }
      }
      detail::JsonPushBack(buffers, std::move(buffer));
    }
    detail::JsonAddMember(output, "buffers", std::move(buffers));
  }

  // IMAGES
  if (model->images.size()) {
    detail::json images;
    detail::JsonReserveArray(images, model->images.size());
    for (unsigned int i = 0; i < model->images.size(); ++i) {
      detail::json image;

      std::string uri;
      if (!UpdateImageObject(model->images[i], baseDir, int(i), embedImages,
                             &fs, &uri_cb, this->WriteImageData,
                             this->write_image_user_data_, &uri)) {
        return false;
      }
      SerializeGltfImage(model->images[i], uri, image);
      detail::JsonPushBack(images, std::move(image));
    }
    detail::JsonAddMember(output, "images", std::move(images));
  }

  if (writeBinary) {
    return WriteBinaryGltfFile(filename, detail::JsonToString(output),
                               binBuffer);
  } else {
    return WriteGltfFile(filename,
                         detail::JsonToString(output, (prettyPrint ? 2 : -1)));
  }
}